

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O0

int __thiscall libnbt::NBTTagList::remove(NBTTagList *this,char *__filename)

{
  char *pcVar1;
  reference ppNVar2;
  __normal_iterator<libnbt::NBTBase_**,_std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>_>
  local_38;
  __normal_iterator<libnbt::NBTBase_**,_std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>_>
  local_30;
  const_iterator local_28;
  char *local_20;
  size_t index_local;
  NBTTagList *this_local;
  
  local_20 = __filename;
  index_local = (size_t)this;
  pcVar1 = (char *)std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::size
                             (&(this->super_NBTTagVector<libnbt::NBTBase_*>).array);
  if (__filename < pcVar1) {
    ppNVar2 = std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::operator[]
                        (&(this->super_NBTTagVector<libnbt::NBTBase_*>).array,(size_type)local_20);
    if (*ppNVar2 != (value_type)0x0) {
      (*(*ppNVar2)->_vptr_NBTBase[5])();
    }
    local_38._M_current =
         (NBTBase **)
         std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::begin
                   (&(this->super_NBTTagVector<libnbt::NBTBase_*>).array);
    local_30 = __gnu_cxx::
               __normal_iterator<libnbt::NBTBase_**,_std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>_>
               ::operator+(&local_38,(difference_type)local_20);
    __gnu_cxx::
    __normal_iterator<libnbt::NBTBase*const*,std::vector<libnbt::NBTBase*,std::allocator<libnbt::NBTBase*>>>
    ::__normal_iterator<libnbt::NBTBase**>
              ((__normal_iterator<libnbt::NBTBase*const*,std::vector<libnbt::NBTBase*,std::allocator<libnbt::NBTBase*>>>
                *)&local_28,&local_30);
    __filename = (char *)std::vector<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>::erase
                                   (&(this->super_NBTTagVector<libnbt::NBTBase_*>).array,local_28);
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
  return (int)CONCAT71((int7)((ulong)__filename >> 8),this_local._7_1_);
}

Assistant:

bool NBTTagList::remove(size_t index) {
        if (index < array.size()) {
            delete (array[index]);
            array.erase(array.begin() + index);
            return true;
        }
        return false;
    }